

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_MoveCtorOnArena_Test::TestBody(ArenaTest_MoveCtorOnArena_Test *this)

{
  NestedTestAllTypes *from;
  TestAllTypes *pTVar1;
  NestedTestAllTypes *this_00;
  uint64_t uVar2;
  Arena *arena_00;
  char *pcVar3;
  AssertionResult gtest_ar;
  uint64_t usage_original;
  uint64_t usage_by_move;
  Arena arena;
  internal local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  AssertHelper local_d0;
  AssertHelper local_c8;
  ThreadSafeArena local_c0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  local_d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceUsed(&local_c0);
  local_c8.data_ = (AssertHelperData *)((ulong)local_c8.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_f0,"arena.SpaceUsed()","0",(unsigned_long *)&local_d8,(int *)&local_c8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1a7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
  }
  else {
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
    from = (NestedTestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::NestedTestAllTypes>((Arena *)&local_c0);
    *(byte *)&from->field_0 = *(byte *)&from->field_0 | 2;
    if ((from->field_0)._impl_.payload_ == (TestAllTypes *)0x0) {
      arena_00 = (Arena *)(from->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena_00 & 1) != 0) {
        arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
      }
      pTVar1 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(arena_00);
      (from->field_0)._impl_.payload_ = pTVar1;
    }
    TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((from->field_0)._impl_.payload_);
    pTVar1 = (from->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      pTVar1 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
    }
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
    local_d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ThreadSafeArena::SpaceUsed(&local_c0);
    this_00 = (NestedTestAllTypes *)Arena::Allocate((Arena *)&local_c0,0x50);
    proto2_unittest::NestedTestAllTypes::NestedTestAllTypes(this_00,(Arena *)&local_c0,from);
    uVar2 = protobuf::internal::ThreadSafeArena::SpaceUsed(&local_c0);
    local_c8.data_ = (AssertHelperData *)(uVar2 - (long)local_d8._M_head_impl);
    pTVar1 = (this_00->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      pTVar1 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
    }
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x50;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_f0,"usage_by_move","sizeof(NestedTestAllTypes)",(unsigned_long *)&local_c8,
               (unsigned_long *)&local_e0);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_e8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1b4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&local_c8.data_[0xe].message.field_2 + 8);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              (local_f0,"usage_by_move + sizeof(TestAllTypes)","usage_original",
               (unsigned_long *)&local_e0,(unsigned_long *)&local_d8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_e8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1b5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
    pTVar1 = (from->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      pTVar1 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
    }
    TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar1);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST(ArenaTest, MoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<NestedTestAllTypes>(&arena);
  TestUtil::SetAllFields(original->mutable_payload());
  TestUtil::ExpectAllFieldsSet(original->payload());

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<NestedTestAllTypes>(&arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  TestUtil::ExpectAllFieldsSet(moved->payload());

  // The only extra allocation with moves is sizeof(NestedTestAllTypes).
  EXPECT_EQ(usage_by_move, sizeof(NestedTestAllTypes));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  TestUtil::ExpectClear(original->payload());
}